

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

section * __thiscall ELFIO::elfio::Sections::add(Sections *this,string *name)

{
  elf_header *peVar1;
  uint uVar2;
  section *psVar3;
  elfio *peVar4;
  ulong uVar5;
  Elf_Word pos;
  string_section_accessor str_writer;
  _Head_base<0UL,_ELFIO::section_*,_false> local_20;
  
  psVar3 = create_section(this->parent);
  (*psVar3->_vptr_section[4])(psVar3,name);
  peVar4 = this->parent;
  peVar1 = (peVar4->header)._M_t.
           super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
           super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if (peVar1 == (elf_header *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar2 = (*peVar1->_vptr_elf_header[0x20])();
    uVar5 = (ulong)(uVar2 & 0xffff);
    peVar4 = this->parent;
  }
  local_20._M_head_impl =
       *(section **)
        &(peVar4->sections_).
         super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
         super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t;
  string_section_accessor_template<ELFIO::section>::add_string
            ((string_section_accessor_template<ELFIO::section> *)&local_20,name);
  (*psVar3->_vptr_section[0x16])(psVar3);
  return psVar3;
}

Assistant:

section* add( const std::string& name ) const
        {
            section* new_section = parent->create_section();
            new_section->set_name( name );

            Elf_Half str_index = parent->get_section_name_str_index();
            section* string_table( parent->sections_[str_index].get() );
            string_section_accessor str_writer( string_table );
            Elf_Word                pos = str_writer.add_string( name );
            new_section->set_name_string_offset( pos );

            return new_section;
        }